

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_openssl.c
# Opt level: O0

int x509_openssl_add_engine_key(SSL_CTX *ssl_ctx,char *x509privatekey_id,ENGINE *engine)

{
  int iVar1;
  EVP_PKEY *pkey;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  EVP_PKEY *evp_key;
  int result;
  ENGINE *engine_local;
  char *x509privatekey_id_local;
  SSL_CTX *ssl_ctx_local;
  
  iVar1 = ENGINE_init((ENGINE *)engine);
  if (iVar1 == 0) {
    log_ERR_get_error("unable to initialize ENGINE.");
    evp_key._4_4_ = 0xe9;
  }
  else {
    iVar1 = ENGINE_set_default((ENGINE *)engine,0xffff);
    if (iVar1 == 0) {
      log_ERR_get_error("unable to configure ENGINE.");
      evp_key._4_4_ = 0xf0;
    }
    else {
      pkey = ENGINE_load_private_key
                       ((ENGINE *)engine,x509privatekey_id,(UI_METHOD *)0x0,(void *)0x0);
      if (pkey == (EVP_PKEY *)0x0) {
        log_ERR_get_error("unable to load private key from ENGINE.");
        evp_key._4_4_ = 0xf9;
      }
      else {
        iVar1 = load_ecc_key(ssl_ctx,(EVP_PKEY *)pkey);
        if (iVar1 == 0) {
          evp_key._4_4_ = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/x509_openssl.c"
                      ,"x509_openssl_add_engine_key",0xff,1,
                      "unable to configure private key from ENGINE.");
          }
          evp_key._4_4_ = 0x100;
        }
        EVP_PKEY_free(pkey);
      }
    }
    iVar1 = ENGINE_finish((ENGINE *)engine);
    if (iVar1 == 0) {
      log_ERR_get_error("unable to release ENGINE functional reference.");
      evp_key._4_4_ = 0x10e;
    }
  }
  return evp_key._4_4_;
}

Assistant:

int x509_openssl_add_engine_key(SSL_CTX* ssl_ctx, const char* x509privatekey_id, ENGINE* engine)
{
    int result;

    // Engine functional reference is short-lived, only within this function.
    if (!ENGINE_init(engine))
    {
        log_ERR_get_error("unable to initialize ENGINE.");
        result = MU_FAILURE;
    }
    else
    {
        if (!ENGINE_set_default(engine, ENGINE_METHOD_ALL))
        {
            log_ERR_get_error("unable to configure ENGINE.");
            result = MU_FAILURE;
        }
        else
        {
            EVP_PKEY* evp_key = ENGINE_load_private_key(engine, x509privatekey_id, NULL, NULL);

            if (evp_key == NULL)
            {
                log_ERR_get_error("unable to load private key from ENGINE.");
                result = MU_FAILURE;
            }
            else
            {
                if (load_ecc_key(ssl_ctx, evp_key) != 0)
                {
                    LogError("unable to configure private key from ENGINE.");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }

                EVP_PKEY_free(evp_key);
            }
        }

        if (!ENGINE_finish(engine))  // Release functional reference.
        {
            log_ERR_get_error("unable to release ENGINE functional reference.");
            result = MU_FAILURE;
        }
    }

    return result;
}